

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::(anonymous_namespace)::
GlobalStructInference::run(wasm::Module*)::GlobalToUnnest,std::allocator<wasm::(anonymous_namespace)
::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest>>,(wasm::Mutability)0,wasm::ModuleUtils
::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,std::vector<wasm::(anonymous_namespace)
::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest,std::allocator<wasm::
(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest>>&)>)::Mapper::
doWalkFunction(wasm::Function__(void *this,Function *curr)

{
  _Rb_tree_color *this_00;
  _Base_ptr p_Var1;
  _Rb_tree_color *p_Var2;
  _Base_ptr *pp_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  _Link_type __z;
  iterator __x;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  Function *local_38;
  Function *curr_local;
  
  this_00 = *(_Rb_tree_color **)((long)this + 0x138);
  pp_Var3 = (_Base_ptr *)(this_00 + 2);
  p_Var4 = (_Base_ptr)pp_Var3;
  p_Var2 = this_00;
  while (p_Var1 = *(_Base_ptr *)(p_Var2 + 4), p_Var1 != (_Base_ptr)0x0) {
    if (*(Function **)(p_Var1 + 1) >= curr) {
      p_Var4 = p_Var1;
    }
    p_Var2 = &p_Var1->_M_color + (ulong)(*(Function **)(p_Var1 + 1) < curr) * 2;
  }
  local_38 = curr;
  if ((p_Var4 != (_Base_ptr)pp_Var3) && (*(Function **)(p_Var4 + 1) <= curr)) {
    __position = std::
                 map<wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                 ::lower_bound((map<wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                                *)this_00,&local_38);
    if ((__position._M_node == (_Base_ptr)pp_Var3) ||
       (__x = __position, curr < *(Function **)(__position._M_node + 1))) {
      __z = (_Link_type)operator_new(0x40);
      *(Function **)(__z->_M_storage)._M_storage = curr;
      (__z->_M_storage)._M_storage[8] = '\0';
      (__z->_M_storage)._M_storage[9] = '\0';
      (__z->_M_storage)._M_storage[10] = '\0';
      (__z->_M_storage)._M_storage[0xb] = '\0';
      (__z->_M_storage)._M_storage[0xc] = '\0';
      (__z->_M_storage)._M_storage[0xd] = '\0';
      (__z->_M_storage)._M_storage[0xe] = '\0';
      (__z->_M_storage)._M_storage[0xf] = '\0';
      (__z->_M_storage)._M_storage[0x10] = '\0';
      (__z->_M_storage)._M_storage[0x11] = '\0';
      (__z->_M_storage)._M_storage[0x12] = '\0';
      (__z->_M_storage)._M_storage[0x13] = '\0';
      (__z->_M_storage)._M_storage[0x14] = '\0';
      (__z->_M_storage)._M_storage[0x15] = '\0';
      (__z->_M_storage)._M_storage[0x16] = '\0';
      (__z->_M_storage)._M_storage[0x17] = '\0';
      (__z->_M_storage)._M_storage[0x18] = '\0';
      (__z->_M_storage)._M_storage[0x19] = '\0';
      (__z->_M_storage)._M_storage[0x1a] = '\0';
      (__z->_M_storage)._M_storage[0x1b] = '\0';
      (__z->_M_storage)._M_storage[0x1c] = '\0';
      (__z->_M_storage)._M_storage[0x1d] = '\0';
      (__z->_M_storage)._M_storage[0x1e] = '\0';
      (__z->_M_storage)._M_storage[0x1f] = '\0';
      pVar5 = std::
              _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
              ::_M_get_insert_hint_unique_pos
                        ((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                          *)this_00,(const_iterator)__position._M_node,(key_type *)&__z->_M_storage)
      ;
      __x._M_node = pVar5.first;
      if (pVar5.second == (_Base_ptr)0x0) {
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
        ::_M_drop_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                        *)__z,(_Link_type)__position._M_node);
      }
      else {
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
        ::_M_insert_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                          *)this_00,__x._M_node,pVar5.second,__z);
        __x._M_node = (_Base_ptr)__z;
      }
    }
    std::
    function<void_(wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_&)>
    ::operator()((function<void_(wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_&)>
                  *)((long)this + 0x140),curr,
                 (vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_> *)
                 ((((_Link_type)__x._M_node)->_M_storage)._M_storage + 8));
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<GlobalToUnnest>>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = std::vector<GlobalToUnnest>, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }